

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
::cni_holder(cni_holder<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
             *this,_func_any_shared_ptr<cs::context_type>_ptr **func)

{
  function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&)> *in_RDI;
  cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
  *this_00;
  function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&)> *in_stack_ffffffffffffffc0;
  _func_any_shared_ptr<cs::context_type>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006b9890;
  this_00 = (cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<cs_impl::any(std::shared_ptr<cs::context_type>const&)>::
  function<cs_impl::any(*const&)(std::shared_ptr<cs::context_type>const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&)>::~function
            ((function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&)> *)0x4cda46);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}